

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O3

bool wasm::canTurnIfIntoBrIf
               (Expression *ifCondition,Expression *brValue,PassOptions *options,Module *wasm)

{
  bool bVar1;
  EffectAnalyzer local_310;
  undefined1 local_1a0 [8];
  EffectAnalyzer value;
  
  if ((ifCondition->type).id == 1) {
    bVar1 = false;
  }
  else if (brValue == (Expression *)0x0) {
    bVar1 = true;
  }
  else {
    EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)local_1a0,options,wasm,brValue);
    bVar1 = false;
    if ((((value.readsMemory == false) &&
         (bVar1 = false,
         value.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0
         )) && (bVar1 = false, (char)value.catchDepth == '\0')) &&
       (value.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0
       )) {
      if ((((value.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ == '\0') &&
           (value.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ == '\0')) &&
          ((value.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ == '\0' &&
           ((value.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ == '\0' &&
            (value.readsTable == false)))))) && (value.module._5_1_ == '\0')) {
        bVar1 = false;
        if ((value.writesTable == false) &&
           (value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
            (_Base_ptr)0x0)) {
          bVar1 = false;
          if ((value.module._4_1_ == '\0') &&
             (bVar1 = false,
             value.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
             (_Base_ptr)0x0)) {
            EffectAnalyzer::EffectAnalyzer(&local_310,options,wasm,ifCondition);
            bVar1 = EffectAnalyzer::invalidates(&local_310,(EffectAnalyzer *)local_1a0);
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::~_Rb_tree(&local_310.delegateTargets._M_t);
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::~_Rb_tree(&local_310.breakTargets._M_t);
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::~_Rb_tree(&local_310.globalsWritten._M_t);
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::~_Rb_tree(&local_310.mutableGlobalsRead._M_t);
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~_Rb_tree(&local_310.localsWritten._M_t);
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~_Rb_tree(&local_310.localsRead._M_t);
            if (local_310.funcEffectsMap.
                super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_310.funcEffectsMap.
                         super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            bVar1 = !bVar1;
          }
        }
      }
      else {
        bVar1 = false;
      }
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&value.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&value.danglingPop);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&value.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&value.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&value.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&value.features);
    if (value.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 value.funcEffectsMap.
                 super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    }
  }
  return bVar1;
}

Assistant:

static bool canTurnIfIntoBrIf(Expression* ifCondition,
                              Expression* brValue,
                              PassOptions& options,
                              Module& wasm) {
  // if the if isn't even reached, this is all dead code anyhow
  if (ifCondition->type == Type::unreachable) {
    return false;
  }
  if (!brValue) {
    return true;
  }
  EffectAnalyzer value(options, wasm, brValue);
  if (value.hasSideEffects()) {
    return false;
  }
  return !EffectAnalyzer(options, wasm, ifCondition).invalidates(value);
}